

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O3

int mbedtls_ecdsa_write_signature_restartable
              (mbedtls_ecdsa_context *ctx,mbedtls_md_type_t md_alg,uchar *hash,size_t hlen,
              uchar *sig,size_t sig_size,size_t *slen,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
              void *p_rng,mbedtls_ecdsa_restart_ctx *rs_ctx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong __n;
  mbedtls_ecdsa_restart_ctx *rs_ctx_00;
  uchar auStack_b8 [8];
  uchar buf [72];
  undefined1 local_68 [8];
  mbedtls_mpi s;
  mbedtls_mpi r;
  uchar *local_38;
  uchar *p;
  
  if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
    uVar1 = 0xffffb080;
  }
  else {
    mbedtls_mpi_init((mbedtls_mpi *)&s.s);
    rs_ctx_00 = (mbedtls_ecdsa_restart_ctx *)0x21614d;
    mbedtls_mpi_init((mbedtls_mpi *)local_68);
    uVar1 = mbedtls_ecdsa_sign_det_restartable
                      (&ctx->grp,(mbedtls_mpi *)&s.s,(mbedtls_mpi *)local_68,&ctx->d,hash,hlen,
                       md_alg,f_rng,p_rng,rs_ctx_00);
    if (uVar1 == 0) {
      local_38 = buf + 0x40;
      buf[0x28] = '\0';
      buf[0x29] = '\0';
      buf[0x2a] = '\0';
      buf[0x2b] = '\0';
      buf[0x2c] = '\0';
      buf[0x2d] = '\0';
      buf[0x2e] = '\0';
      buf[0x2f] = '\0';
      buf[0x30] = '\0';
      buf[0x31] = '\0';
      buf[0x32] = '\0';
      buf[0x33] = '\0';
      buf[0x34] = '\0';
      buf[0x35] = '\0';
      buf[0x36] = '\0';
      buf[0x37] = '\0';
      buf[0x18] = '\0';
      buf[0x19] = '\0';
      buf[0x1a] = '\0';
      buf[0x1b] = '\0';
      buf[0x1c] = '\0';
      buf[0x1d] = '\0';
      buf[0x1e] = '\0';
      buf[0x1f] = '\0';
      buf[0x20] = '\0';
      buf[0x21] = '\0';
      buf[0x22] = '\0';
      buf[0x23] = '\0';
      buf[0x24] = '\0';
      buf[0x25] = '\0';
      buf[0x26] = '\0';
      buf[0x27] = '\0';
      buf[8] = '\0';
      buf[9] = '\0';
      buf[10] = '\0';
      buf[0xb] = '\0';
      buf[0xc] = '\0';
      buf[0xd] = '\0';
      buf[0xe] = '\0';
      buf[0xf] = '\0';
      buf[0x10] = '\0';
      buf[0x11] = '\0';
      buf[0x12] = '\0';
      buf[0x13] = '\0';
      buf[0x14] = '\0';
      buf[0x15] = '\0';
      buf[0x16] = '\0';
      buf[0x17] = '\0';
      auStack_b8[0] = '\0';
      auStack_b8[1] = '\0';
      auStack_b8[2] = '\0';
      auStack_b8[3] = '\0';
      auStack_b8[4] = '\0';
      auStack_b8[5] = '\0';
      auStack_b8[6] = '\0';
      auStack_b8[7] = '\0';
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = '\0';
      buf[3] = '\0';
      buf[4] = '\0';
      buf[5] = '\0';
      buf[6] = '\0';
      buf[7] = '\0';
      buf[0x38] = '\0';
      buf[0x39] = '\0';
      buf[0x3a] = '\0';
      buf[0x3b] = '\0';
      buf[0x3c] = '\0';
      buf[0x3d] = '\0';
      buf[0x3e] = '\0';
      buf[0x3f] = '\0';
      uVar2 = mbedtls_asn1_write_mpi(&local_38,auStack_b8,(mbedtls_mpi *)local_68);
      uVar1 = uVar2;
      if ((-1 < (int)uVar2) &&
         (uVar1 = mbedtls_asn1_write_mpi(&local_38,auStack_b8,(mbedtls_mpi *)&s.s), -1 < (int)uVar1)
         ) {
        uVar2 = uVar1 + uVar2;
        uVar3 = mbedtls_asn1_write_len(&local_38,auStack_b8,(ulong)uVar2);
        uVar1 = uVar3;
        if ((-1 < (int)uVar3) &&
           (uVar1 = mbedtls_asn1_write_tag(&local_38,auStack_b8,'0'), -1 < (int)uVar1)) {
          __n = (ulong)uVar2 + (ulong)uVar1 + (ulong)uVar3;
          uVar1 = 0xffffb100;
          if (__n <= sig_size) {
            memcpy(sig,local_38,__n);
            *slen = __n;
            uVar1 = 0;
          }
        }
      }
    }
    mbedtls_mpi_free((mbedtls_mpi *)&s.s);
    mbedtls_mpi_free((mbedtls_mpi *)local_68);
  }
  return uVar1;
}

Assistant:

int mbedtls_ecdsa_write_signature_restartable(mbedtls_ecdsa_context *ctx,
                                              mbedtls_md_type_t md_alg,
                                              const unsigned char *hash, size_t hlen,
                                              unsigned char *sig, size_t sig_size, size_t *slen,
                                              int (*f_rng)(void *, unsigned char *, size_t),
                                              void *p_rng,
                                              mbedtls_ecdsa_restart_ctx *rs_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi r, s;
    if (f_rng == NULL) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    mbedtls_mpi_init(&r);
    mbedtls_mpi_init(&s);

#if defined(MBEDTLS_ECDSA_DETERMINISTIC)
    MBEDTLS_MPI_CHK(mbedtls_ecdsa_sign_det_restartable(&ctx->grp, &r, &s, &ctx->d,
                                                       hash, hlen, md_alg, f_rng,
                                                       p_rng, rs_ctx));
#else
    (void) md_alg;

#if defined(MBEDTLS_ECDSA_SIGN_ALT)
    (void) rs_ctx;

    MBEDTLS_MPI_CHK(mbedtls_ecdsa_sign(&ctx->grp, &r, &s, &ctx->d,
                                       hash, hlen, f_rng, p_rng));
#else
    /* Use the same RNG for both blinding and ephemeral key generation */
    MBEDTLS_MPI_CHK(mbedtls_ecdsa_sign_restartable(&ctx->grp, &r, &s, &ctx->d,
                                                   hash, hlen, f_rng, p_rng, f_rng,
                                                   p_rng, rs_ctx));
#endif /* MBEDTLS_ECDSA_SIGN_ALT */
#endif /* MBEDTLS_ECDSA_DETERMINISTIC */

    MBEDTLS_MPI_CHK(ecdsa_signature_to_asn1(&r, &s, sig, sig_size, slen));

cleanup:
    mbedtls_mpi_free(&r);
    mbedtls_mpi_free(&s);

    return ret;
}